

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O3

void __thiscall
Snake::UpdateBody(Snake *this,SDL_Point *current_head_cell,SDL_Point *prev_head_cell)

{
  pointer *ppSVar1;
  int iVar2;
  int iVar3;
  iterator __position;
  pointer __dest;
  SDL_Point *item;
  pointer pSVar4;
  pointer pSVar5;
  
  __position._M_current =
       (this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<SDL_Point,std::allocator<SDL_Point>>::_M_realloc_insert<SDL_Point_const&>
              ((vector<SDL_Point,std::allocator<SDL_Point>> *)&this->body,__position,prev_head_cell)
    ;
  }
  else {
    *__position._M_current = *prev_head_cell;
    ppSVar1 = &(this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  if (this->growing == false) {
    __dest = (this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar5 = (this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar4 = __dest + 1;
    if (pSVar4 != pSVar5) {
      memmove(__dest,pSVar4,(long)pSVar5 - (long)pSVar4);
      pSVar5 = (this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    pSVar5 = pSVar5 + -1;
    (this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar5;
  }
  else {
    this->growing = false;
    this->size = this->size + 1;
    pSVar5 = (this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  pSVar4 = (this->body).super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pSVar4 != pSVar5) {
    iVar2 = current_head_cell->x;
    iVar3 = current_head_cell->y;
    do {
      if ((iVar2 == pSVar4->x) && (iVar3 == pSVar4->y)) {
        this->alive = false;
      }
      pSVar4 = pSVar4 + 1;
    } while (pSVar4 != pSVar5);
  }
  return;
}

Assistant:

void Snake::UpdateBody(SDL_Point &current_head_cell, SDL_Point &prev_head_cell) {
  // Add previous head location to vector
  body.push_back(prev_head_cell);

  if (!growing) {
    // Remove the tail from the vector.
    body.erase(body.begin());
  } else {
    growing = false;
    size++;
  }

  // Check if the snake has died.
  for (auto const &item : body) {
    if (current_head_cell.x == item.x && current_head_cell.y == item.y) {
      alive = false;
    }
  }
}